

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsConvertValueToString(JsValueRef value,JsValueRef *result)

{
  anon_class_16_2_1884b1c3 fn;
  anon_class_16_2_1884b1c3 fn_00;
  bool bVar1;
  JsValueRef *local_20;
  JsValueRef *result_local;
  JsValueRef value_local;
  
  if (result == (JsValueRef *)0x0) {
    value_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *result = (JsValueRef)0x0;
    local_20 = result;
    result_local = (JsValueRef *)value;
    if ((value == (JsValueRef)0x0) || (bVar1 = Js::VarIs<Js::JavascriptString>(value), !bVar1)) {
      fn.result = &local_20;
      fn.value = &result_local;
      value_local._4_4_ = ContextAPIWrapper<false,JsConvertValueToString::__1>(fn);
    }
    else {
      fn_00.result = &local_20;
      fn_00.value = &result_local;
      value_local._4_4_ = ContextAPINoScriptWrapper<JsConvertValueToString::__0>(fn_00,false,false);
    }
  }
  return value_local._4_4_;
}

Assistant:

CHAKRA_API JsConvertValueToString(_In_ JsValueRef value, _Out_ JsValueRef *result)
{
    PARAM_NOT_NULL(result);
    *result = nullptr;

    if (value != nullptr && Js::VarIs<Js::JavascriptString>(value))
    {
        return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToStringConversion, (Js::Var)value);
            VALIDATE_INCOMING_REFERENCE(value, scriptContext);

            *result = value;

            PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

            return JsNoError;
        });
    }

    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToStringConversion, (Js::Var)value);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        *result = (JsValueRef) Js::JavascriptConversion::ToString((Js::Var)value, scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}